

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varnode.cc
# Opt level: O2

const_iterator __thiscall
VarnodeBank::beginLoc(VarnodeBank *this,int4 s,Address *addr,Address *pc,uintm uniq)

{
  const_iterator cVar1;
  SeqNum sq;
  PcodeOp searchop;
  key_type local_a0;
  SeqNum local_98;
  PcodeOp local_80;
  
  (this->searchvn).size = s;
  (this->searchvn).loc.base = addr->base;
  (this->searchvn).loc.offset = addr->offset;
  (this->searchvn).flags = 0x10;
  if (uniq == 0xffffffff) {
    uniq = 0;
  }
  local_98.pc.base = pc->base;
  local_98.pc.offset = pc->offset;
  local_98.uniq = uniq;
  PcodeOp::PcodeOp(&local_80,0,&local_98);
  (this->searchvn).def = &local_80;
  local_a0 = &this->searchvn;
  cVar1 = std::
          _Rb_tree<Varnode_*,_Varnode_*,_std::_Identity<Varnode_*>,_VarnodeCompareLocDef,_std::allocator<Varnode_*>_>
          ::lower_bound(&(this->loc_tree)._M_t,&local_a0);
  (this->searchvn).flags = 8;
  (this->searchvn).size = 0;
  std::_Vector_base<Varnode_*,_std::allocator<Varnode_*>_>::~_Vector_base
            (&local_80.inrefs.super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>);
  return (const_iterator)cVar1._M_node;
}

Assistant:

VarnodeLocSet::const_iterator VarnodeBank::beginLoc(int4 s,const Address &addr,
						    const Address &pc,uintm uniq) const

{				// Find first varnode of given loc and size
				// defined at a particular location
  VarnodeLocSet::const_iterator iter;
  searchvn.size = s;
  searchvn.loc = addr;
  searchvn.flags = Varnode::written;
  if (uniq==~((uintm)0))	// If don't care about uniq
    uniq = 0;			// find earliest
  SeqNum sq(pc,uniq);
  PcodeOp searchop(0,sq);
  searchvn.def = &searchop;
  iter = loc_tree.lower_bound(&searchvn);

  searchvn.size = 0;
  searchvn.flags = Varnode::input;
  return iter;
}